

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highs_c_api.cpp
# Opt level: O3

HighsInt Highs_getInt64InfoValue(void *highs,char *info,int64_t *value)

{
  HighsStatus HVar1;
  allocator local_39;
  string local_38;
  
  std::__cxx11::string::string((string *)&local_38,info,&local_39);
  HVar1 = Highs::getInfoValue((Highs *)highs,&local_38,value);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p);
  }
  return HVar1;
}

Assistant:

HighsInt Highs_getInt64InfoValue(const void* highs, const char* info,
                                 int64_t* value) {
  return (HighsInt)((Highs*)highs)->getInfoValue(info, *value);
}